

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# X86DisassemblerDecoder.c
# Opt level: O3

int getIDWithAttrMask(uint16_t *instructionID,InternalInstruction *insn,uint16_t attrMask)

{
  uint uVar1;
  InstrUID IVar2;
  int iVar3;
  OpcodeDecision *pOVar4;
  uint8_t modRM;
  uint8_t *puVar5;
  byte opcode;
  InstructionContext IVar6;
  InstructionContext insnContext;
  OpcodeType type;
  
  opcode = insn->opcode;
  type = insn->opcodeType;
  if ((ulong)opcode == 0xe) {
    IVar2 = 0x2fc;
    if (type == T3DNOW_MAP) goto LAB_001a02a6;
LAB_001a0211:
    IVar6 = (InstructionContext)""[attrMask];
    uVar1 = type - TWOBYTE;
    if (uVar1 < 6) {
      pOVar4 = (OpcodeDecision *)(&DAT_0023a358 + *(int *)(&DAT_0023a358 + (ulong)uVar1 * 4));
      puVar5 = &DAT_0023a370 + *(int *)(&DAT_0023a370 + (ulong)uVar1 * 4);
    }
    else {
      puVar5 = "\x01\x02\x03\x04";
      pOVar4 = x86DisassemblerOneByteOpcodes;
    }
    insnContext = (InstructionContext)""[attrMask];
    if ((puVar5[insnContext] != 0) &&
       (pOVar4[puVar5[insnContext] - 1].modRMDecisions[opcode].modrm_type != '\0'))
    goto LAB_001a026f;
    modRM = '\0';
  }
  else {
    IVar6 = IC_OF;
    if (type != T3DNOW_MAP) goto LAB_001a0211;
LAB_001a026f:
    iVar3 = readModRM(insn);
    if (iVar3 != 0) {
      return -1;
    }
    type = insn->opcodeType;
    opcode = insn->opcode;
    modRM = insn->modRM;
    insnContext = IVar6;
  }
  IVar2 = decode(type,insnContext,opcode,modRM);
LAB_001a02a6:
  *instructionID = IVar2;
  return 0;
}

Assistant:

static int getIDWithAttrMask(uint16_t *instructionID,
		struct InternalInstruction *insn,
		uint16_t attrMask)
{
	bool hasModRMExtension;

	InstructionContext instructionClass;

#ifndef CAPSTONE_X86_REDUCE
	// HACK for femms. to be handled properly in next version 3.x
	if (insn->opcode == 0x0e && insn->opcodeType == T3DNOW_MAP) {
		*instructionID = X86_FEMMS;
		return 0;
	}
#endif

	if (insn->opcodeType == T3DNOW_MAP)
		instructionClass = IC_OF;
	else
		instructionClass = contextForAttrs(attrMask);

	hasModRMExtension = modRMRequired(insn->opcodeType,
			instructionClass,
			insn->opcode);

	if (hasModRMExtension) {
		if (readModRM(insn))
			return -1;

		*instructionID = decode(insn->opcodeType,
				instructionClass,
				insn->opcode,
				insn->modRM);
	} else {
		*instructionID = decode(insn->opcodeType,
				instructionClass,
				insn->opcode,
				0);
	}

	return 0;
}